

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::Builder::getMemberElementPtr
          (Builder *this,shared_ptr<mocker::ir::Addr> *base,string *className,string *varName)

{
  BuilderContext *this_00;
  string *hint;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  shared_ptr<mocker::ir::Reg> sVar1;
  OpType local_110;
  allocator<char> local_109;
  string local_108 [39];
  undefined1 local_e1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined1 local_d8 [8];
  shared_ptr<mocker::ir::IntLiteral> offsetLit;
  size_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  shared_ptr<mocker::ir::AttachedComment> attachedComment;
  string *varName_local;
  string *className_local;
  shared_ptr<mocker::ir::Addr> *base_local;
  Builder *this_local;
  shared_ptr<mocker::ir::Reg> *varPtr;
  
  attachedComment.super___shared_ptr<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_R8;
  std::operator+(&local_a0,"getElementPtr: ",varName);
  std::operator+(&local_80,&local_a0,"::");
  std::operator+(&local_60,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 attachedComment.
                 super___shared_ptr<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
  std::make_shared<mocker::ir::AttachedComment,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  this_00 = (BuilderContext *)
            (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::AttachedComment,void>
            ((shared_ptr<mocker::ir::IRInst> *)&offset,
             (shared_ptr<mocker::ir::AttachedComment> *)local_40);
  BuilderContext::appendInst(this_00,(shared_ptr<mocker::ir::IRInst> *)&offset);
  std::shared_ptr<mocker::ir::IRInst>::~shared_ptr((shared_ptr<mocker::ir::IRInst> *)&offset);
  local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             BuilderContext::getOffset
                       ((BuilderContext *)
                        (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi,varName,
                        attachedComment.
                        super___shared_ptr<mocker::ir::AttachedComment,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
  offsetLit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_e0;
  std::make_shared<mocker::ir::IntLiteral,long>((long *)local_d8);
  local_e1 = 0;
  hint = (string *)
         (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"varPtr",&local_109);
  BuilderContext::makeTempLocalReg((BuilderContext *)this,hint);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  local_110 = Add;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::IntLiteral>&>
            ((BuilderContext *)
             (base->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,(shared_ptr<mocker::ir::Reg> *)this,&local_110,
             (shared_ptr<mocker::ir::Addr> *)className,
             (shared_ptr<mocker::ir::IntLiteral> *)local_d8);
  local_e1 = 1;
  std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
            ((shared_ptr<mocker::ir::IntLiteral> *)local_d8);
  std::shared_ptr<mocker::ir::AttachedComment>::~shared_ptr
            ((shared_ptr<mocker::ir::AttachedComment> *)local_40);
  sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg>
Builder::getMemberElementPtr(const std::shared_ptr<Addr> &base,
                             const std::string &className,
                             const std::string &varName) const {
  auto attachedComment = std::make_shared<AttachedComment>(
      "getElementPtr: " + className + "::" + varName);
  ctx.appendInst(std::move(attachedComment));

  std::size_t offset = ctx.getOffset(className, varName);
  auto offsetLit = std::make_shared<IntLiteral>((Integer)offset);
  auto varPtr = ctx.makeTempLocalReg("varPtr");
  ctx.emplaceInst<ArithBinaryInst>(varPtr, ArithBinaryInst::Add, base,
                                   offsetLit);
  return varPtr;
}